

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O3

ValueLength ReadVariableLengthValue<false>(uint8_t **p,uint8_t *end)

{
  byte bVar1;
  byte *pbVar2;
  ValueLength VVar3;
  ValueLength extraout_RAX;
  ulong uVar4;
  byte *pbVar5;
  uint8_t c;
  bool bVar6;
  
  VVar3 = 0;
  uVar4 = 0;
  pbVar2 = *p;
  do {
    pbVar5 = pbVar2 + 1;
    bVar1 = *pbVar2;
    VVar3 = ((ulong)(bVar1 & 0x7f) << ((byte)uVar4 & 0x3f)) + VVar3;
    *p = pbVar5;
    if (-1 < (char)bVar1) {
      return VVar3;
    }
  } while ((pbVar5 != end) && (bVar6 = uVar4 < 0x32, uVar4 = uVar4 + 7, pbVar2 = pbVar5, bVar6));
  ReadVariableLengthValue<false>();
  return extraout_RAX;
}

Assistant:

static ValueLength ReadVariableLengthValue(uint8_t const*& p,
                                           uint8_t const* end) {
  ValueLength value = 0;
  ValueLength shifter = 0;
  while (true) {
    uint8_t c = *p;
    VELOCYPACK_ASSERT(shifter <= 8 * 7);
    value += static_cast<ValueLength>(c & 0x7fU) << shifter;
    shifter += 7;
    if (reverse) {
      --p;
    } else {
      ++p;
    }
    if (!(c & 0x80U)) {
      break;
    }
    if (VELOCYPACK_UNLIKELY(p == end || shifter > 7 * 8)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Compound value length value is out of bounds");
    }
  }
  return value;
}